

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::Texture2DLodControlTestInstance::Texture2DLodControlTestInstance
          (Texture2DLodControlTestInstance *this,Context *context,
          Texture2DMipmapTestCaseParameters *testParameters)

{
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *this_00;
  deInt32 *pdVar1;
  char *pcVar2;
  Precision PVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  WrapMode WVar7;
  WrapMode WVar8;
  VkFormat VVar9;
  undefined4 uVar10;
  SharedPtrStateBase *pSVar11;
  TestTexture2D *pTVar12;
  SharedPtrStateBase *pSVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  deInt32 *pdVar18;
  int iVar19;
  RGBA local_84;
  TextureRenderer *local_80;
  Texture2DLodControlTestInstance *local_78;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *local_70;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DLodControlTestInstance_00d38a48;
  this->m_texWidth = 0x40;
  this->m_texHeight = 0x40;
  PVar3 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          texCoordPrecision;
  FVar4 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          minFilter;
  FVar5 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          magFilter;
  FVar6 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          magFilter;
  WVar7 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          wrapS;
  WVar8 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          wrapT;
  VVar9 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          format;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  sampleCount = (testParameters->super_Texture2DTestCaseParameters).
                super_TextureCommonTestCaseParameters.sampleCount;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  texCoordPrecision = PVar3;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  minFilter = FVar4;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  magFilter = FVar5;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  magFilter = FVar6;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  wrapS = WVar7;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  wrapT = WVar8;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  format = VVar9;
  this_00 = &(this->m_testParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.programs;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            (this_00,&(testParameters->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.programs);
  iVar19 = (testParameters->super_Texture2DTestCaseParameters).height;
  (this->m_testParameters).super_Texture2DTestCaseParameters.width =
       (testParameters->super_Texture2DTestCaseParameters).width;
  (this->m_testParameters).super_Texture2DTestCaseParameters.height = iVar19;
  uVar10 = *(undefined4 *)&(testParameters->super_TextureMipmapCommonTestCaseParameters).field_0x4;
  pcVar2 = (testParameters->super_TextureMipmapCommonTestCaseParameters).minFilterName;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType =
       (testParameters->super_TextureMipmapCommonTestCaseParameters).coordType;
  *(undefined4 *)&(this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.field_0x4 =
       uVar10;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar2;
  this->m_minFilter =
       (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
       minFilter;
  (this->m_texture).m_ptr = (TestTexture2D *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  local_78 = this;
  local_70 = this_00;
  pSVar11 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar11->strongRefCount = 0;
  pSVar11->weakRefCount = 0;
  pSVar11->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d38660;
  pSVar11[1]._vptr_SharedPtrStateBase = (_func_int **)0x0;
  (this->m_texture).m_state = pSVar11;
  pSVar11->strongRefCount = 1;
  pSVar11->weakRefCount = 1;
  local_80 = &this->m_renderer;
  util::TextureRenderer::TextureRenderer
            (local_80,context,
             (testParameters->super_Texture2DTestCaseParameters).
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  uVar16 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar16 = this->m_texWidth;
  }
  if (uVar16 == 0) {
    uVar15 = 0x20;
  }
  else {
    uVar15 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar15 = uVar15 ^ 0x1f;
  }
  pTVar12 = (TestTexture2D *)operator_new(0x70);
  local_58.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  pipeline::TestTexture2D::TestTexture2D
            (pTVar12,(TextureFormat *)&local_58,this->m_texWidth,this->m_texHeight);
  pSVar13 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar13->strongRefCount;
  pSVar13->strongRefCount = 0;
  pSVar13->weakRefCount = 0;
  pSVar13->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d38660;
  pSVar13[1]._vptr_SharedPtrStateBase = (_func_int **)pTVar12;
  pSVar13->strongRefCount = 1;
  pSVar13->weakRefCount = 1;
  pSVar11 = (this->m_texture).m_state;
  if (pSVar11 != pSVar13) {
    if (pSVar11 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar18 = &pSVar11->strongRefCount;
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        (this->m_texture).m_ptr = (TestTexture2D *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar18 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        pSVar11 = (this->m_texture).m_state;
        if (pSVar11 != (SharedPtrStateBase *)0x0) {
          (*pSVar11->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_texture).m_ptr = pTVar12;
    (this->m_texture).m_state = pSVar13;
    LOCK();
    pSVar13->strongRefCount = pSVar13->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar18 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar18 = *pdVar18 + 1;
    UNLOCK();
  }
  pdVar18 = &pSVar13->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[2])(pSVar13);
  }
  LOCK();
  *pdVar18 = *pdVar18 + -1;
  UNLOCK();
  if (*pdVar18 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[1])(pSVar13);
  }
  if (uVar16 != 0) {
    iVar14 = 0x1f - uVar15;
    uVar17 = 0;
    iVar19 = 0;
    if (0 < iVar14) {
      iVar19 = iVar14;
    }
    do {
      pTVar12 = (this->m_texture).m_ptr;
      (*(pTVar12->super_TestTexture)._vptr_TestTexture[7])(&local_58,pTVar12,uVar17,0);
      uVar15 = (int)(0xff / (long)iVar14) * (int)uVar17;
      uVar16 = uVar15;
      if (0xfe < uVar15) {
        uVar16 = 0xff;
      }
      local_84.m_value = uVar16 * 0x10100 ^ 0xff00ffff;
      if ((int)uVar15 < 0) {
        local_84.m_value = 0xff00ffff;
      }
      tcu::RGBA::toVec(&local_84);
      tcu::clear(&local_58,&local_68);
      uVar16 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar16;
    } while (iVar19 + 1U != uVar16);
  }
  util::TextureRenderer::add2DTexture(local_80,&this->m_texture);
  return;
}

Assistant:

Texture2DLodControlTestInstance::Texture2DLodControlTestInstance (Context& context, const Texture2DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(64) //64
	, m_texHeight		(64)//64
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat	format		= VK_FORMAT_R8G8B8A8_UNORM;
	const int		numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(format), m_texWidth, m_texHeight));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec());
	}

	m_renderer.add2DTexture(m_texture);
}